

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_inr
          (CImg<unsigned_char> *this,FILE *file,char *filename,float *voxel_size)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  unsigned_short uVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  int x;
  FILE *__stream;
  uchar *ptr;
  long lVar8;
  char *pcVar9;
  unsigned_short *ptr_00;
  short *ptr_01;
  uint *ptr_02;
  int *ptr_03;
  float *pfVar10;
  double *pdVar11;
  CImgIOException *this_00;
  uchar *puVar12;
  char *pcVar13;
  unsigned_short *puVar14;
  short *psVar15;
  uint *puVar16;
  int *piVar17;
  float *pfVar18;
  double *pdVar19;
  long lVar20;
  int y;
  long lVar21;
  pointer_____offset_0x10___ *ppuVar22;
  ulong uVar23;
  long lVar24;
  int z;
  long lVar25;
  int z_9;
  int fopt [8];
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar9 = "non-";
    if (this->_is_shared != false) {
      pcVar9 = "";
    }
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar9,"unsigned char");
    ppuVar22 = &CImgArgumentException::typeinfo;
LAB_001a85f8:
    __cxa_throw(this_00,ppuVar22,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  if (voxel_size != (float *)0x0) {
    voxel_size[2] = 1.0;
    voxel_size[0] = 1.0;
    voxel_size[1] = 1.0;
  }
  _load_inr_header((FILE *)__stream,fopt,voxel_size);
  assign(this,fopt[0],fopt[1],fopt[2],fopt[3]);
  if ((fopt[6] == 8 && fopt[4] == 0) && fopt[5] == 0) {
    ptr = (uchar *)operator_new__((long)fopt[3] * (long)fopt[0]);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<unsigned_char>(ptr,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        puVar12 = ptr;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = puVar12[lVar20];
          }
          puVar12 = puVar12 + lVar20;
        }
      }
    }
    operator_delete__(ptr);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((bool)((fopt[5] == 1 && fopt[4] == 0) & fopt[6] == 8 & ~bVar3)) {
    pcVar9 = (char *)operator_new__((long)fopt[3] * (long)fopt[0]);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<char>(pcVar9,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        pcVar13 = pcVar9;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = pcVar13[lVar20];
          }
          pcVar13 = pcVar13 + lVar20;
        }
      }
    }
    operator_delete__(pcVar9);
    bVar3 = true;
  }
  if ((((!bVar3) && (fopt[6] == 0x10)) && (fopt[4] == 0)) && (fopt[5] == 0)) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 2;
    if ((long)fopt[3] * (long)fopt[0] < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    ptr_00 = (unsigned_short *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<unsigned_short>(ptr_00,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<unsigned_short>(ptr_00,(long)fopt[3] * (long)fopt[0]);
        }
        puVar14 = ptr_00;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            uVar4 = *puVar14;
            puVar14 = puVar14 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)uVar4;
          }
        }
      }
    }
    operator_delete__(ptr_00);
    bVar3 = true;
  }
  if (((!bVar3) && (fopt[6] == 0x10)) && ((fopt[4] == 0 && (fopt[5] == 1)))) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 2;
    if ((long)fopt[3] * (long)fopt[0] < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    ptr_01 = (short *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<short>(ptr_01,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<short>(ptr_01,(long)fopt[3] * (long)fopt[0]);
        }
        psVar15 = ptr_01;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            sVar5 = *psVar15;
            psVar15 = psVar15 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)sVar5;
          }
        }
      }
    }
    operator_delete__(ptr_01);
    bVar3 = true;
  }
  if (((!bVar3) && (fopt[6] == 0x20)) && ((fopt[4] == 0 && (fopt[5] == 0)))) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 4;
    if (0x3fffffffffffffff < (ulong)((long)fopt[3] * (long)fopt[0])) {
      uVar23 = 0xffffffffffffffff;
    }
    ptr_02 = (uint *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<unsigned_int>(ptr_02,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<unsigned_int>(ptr_02,(long)fopt[3] * (long)fopt[0]);
        }
        puVar16 = ptr_02;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            uVar6 = *puVar16;
            puVar16 = puVar16 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)uVar6;
          }
        }
      }
    }
    operator_delete__(ptr_02);
    bVar3 = true;
  }
  if ((((!bVar3) && (fopt[6] == 0x20)) && (fopt[4] == 0)) && (fopt[5] == 1)) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 4;
    if (0x3fffffffffffffff < (ulong)((long)fopt[3] * (long)fopt[0])) {
      uVar23 = 0xffffffffffffffff;
    }
    ptr_03 = (int *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<int>(ptr_03,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<int>(ptr_03,(long)fopt[3] * (long)fopt[0]);
        }
        piVar17 = ptr_03;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            iVar7 = *piVar17;
            piVar17 = piVar17 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)iVar7;
          }
        }
      }
    }
    operator_delete__(ptr_03);
    bVar3 = true;
  }
  if (((!bVar3) && (fopt[6] == 0x20)) && ((fopt[4] == 1 && (fopt[5] == 0)))) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 4;
    if (0x3fffffffffffffff < (ulong)((long)fopt[3] * (long)fopt[0])) {
      uVar23 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<float>(pfVar10,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<float>(pfVar10,(long)fopt[3] * (long)fopt[0]);
        }
        pfVar18 = pfVar10;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            fVar1 = *pfVar18;
            pfVar18 = pfVar18 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)(int)fVar1;
          }
        }
      }
    }
    operator_delete__(pfVar10);
    bVar3 = true;
  }
  if (((!bVar3) && (fopt[6] == 0x20)) && ((fopt[4] == 1 && (fopt[5] == 1)))) {
    uVar23 = (long)fopt[3] * (long)fopt[0] * 4;
    if (0x3fffffffffffffff < (ulong)((long)fopt[3] * (long)fopt[0])) {
      uVar23 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar23);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<float>(pfVar10,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<float>(pfVar10,(long)fopt[3] * (long)fopt[0]);
        }
        pfVar18 = pfVar10;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            fVar1 = *pfVar18;
            pfVar18 = pfVar18 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)(int)fVar1;
          }
        }
      }
    }
    operator_delete__(pfVar10);
    bVar3 = true;
  }
  if ((((!bVar3) && (fopt[6] == 0x40)) && (fopt[4] == 1)) && (fopt[5] == 0)) {
    pdVar11 = (double *)
              operator_new__(-(ulong)((ulong)((long)fopt[3] * (long)fopt[0]) >> 0x3d != 0) |
                             (long)fopt[3] * (long)fopt[0] * 8);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<double>(pdVar11,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<double>(pdVar11,(long)fopt[3] * (long)fopt[0]);
        }
        pdVar19 = pdVar11;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            dVar2 = *pdVar19;
            pdVar19 = pdVar19 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)(int)dVar2;
          }
        }
      }
    }
    operator_delete__(pdVar11);
    bVar3 = true;
  }
  if (((bVar3) || (fopt[6] != 0x40)) || ((fopt[4] != 1 || (fopt[5] != 1)))) {
    if (!bVar3) {
      if (file == (FILE *)0x0) {
        cimg::fclose(__stream);
      }
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar9 = "non-";
      if (this->_is_shared != false) {
        pcVar9 = "";
      }
      pcVar13 = "(FILE*)";
      if (filename != (char *)0x0) {
        pcVar13 = filename;
      }
      CImgIOException::CImgIOException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Unknown pixel type defined in file \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar9,"unsigned char",pcVar13);
      ppuVar22 = &CImgIOException::typeinfo;
      goto LAB_001a85f8;
    }
  }
  else {
    pdVar11 = (double *)
              operator_new__(-(ulong)((ulong)((long)fopt[3] * (long)fopt[0]) >> 0x3d != 0) |
                             (long)fopt[3] * (long)fopt[0] * 8);
    for (lVar25 = 0; lVar25 < (int)this->_depth; lVar25 = lVar25 + 1) {
      for (lVar21 = 0; lVar21 < (int)this->_height; lVar21 = lVar21 + 1) {
        cimg::fread<double>(pdVar11,(long)fopt[3] * (long)fopt[0],(FILE *)__stream);
        if (fopt[7] != 0) {
          cimg::invert_endianness<double>(pdVar11,(long)fopt[3] * (long)fopt[0]);
        }
        pdVar19 = pdVar11;
        for (lVar8 = 0; lVar8 < (int)this->_width; lVar8 = lVar8 + 1) {
          for (lVar20 = 0; lVar20 < (int)this->_spectrum; lVar20 = lVar20 + 1) {
            dVar2 = *pdVar19;
            pdVar19 = pdVar19 + 1;
            lVar24 = (ulong)this->_height * (ulong)this->_width;
            this->_data
            [(ulong)this->_depth * lVar20 * lVar24 +
             lVar24 * lVar25 + lVar8 + lVar21 * (ulong)this->_width] = (uchar)(int)dVar2;
          }
        }
      }
    }
    operator_delete__(pdVar11);
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(__stream);
  }
  return this;
}

Assistant:

CImg<T>& _load_inr(std::FILE *const file, const char *const filename, float *const voxel_size) {
#define _cimg_load_inr_case(Tf,sign,pixsize,Ts) \
     if (!loaded && fopt[6]==pixsize && fopt[4]==Tf && fopt[5]==sign) { \
        Ts *xval, *const val = new Ts[(size_t)fopt[0]*fopt[3]]; \
        cimg_forYZ(*this,y,z) { \
            cimg::fread(val,fopt[0]*fopt[3],nfile); \
            if (fopt[7]!=endian) cimg::invert_endianness(val,fopt[0]*fopt[3]); \
            xval = val; cimg_forX(*this,x) cimg_forC(*this,c) (*this)(x,y,z,c) = (T)*(xval++); \
          } \
        delete[] val; \
        loaded = true; \
      }

      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_inr(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      int fopt[8], endian = cimg::endianness()?1:0;
      bool loaded = false;
      if (voxel_size) voxel_size[0] = voxel_size[1] = voxel_size[2] = 1;
      _load_inr_header(nfile,fopt,voxel_size);
      assign(fopt[0],fopt[1],fopt[2],fopt[3]);
      _cimg_load_inr_case(0,0,8,unsigned char);
      _cimg_load_inr_case(0,1,8,char);
      _cimg_load_inr_case(0,0,16,unsigned short);
      _cimg_load_inr_case(0,1,16,short);
      _cimg_load_inr_case(0,0,32,unsigned int);
      _cimg_load_inr_case(0,1,32,int);
      _cimg_load_inr_case(1,0,32,float);
      _cimg_load_inr_case(1,1,32,float);
      _cimg_load_inr_case(1,0,64,double);
      _cimg_load_inr_case(1,1,64,double);
      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_inr(): Unknown pixel type defined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }